

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O1

void WriteTableDescriptionString(ostream *strmOut,TableId ti)

{
  double dVar1;
  fontTableId32 fVar2;
  mapped_type_conflict *pmVar3;
  size_t sVar4;
  ostream *poVar5;
  int fxdVersion;
  char csTagStr [8];
  char local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined2 local_43;
  undefined1 local_41;
  string local_40;
  
  fVar2 = TtfUtil::TableIdTag(ti);
  local_48 = ' ';
  local_47 = (undefined1)(fVar2 >> 0x18);
  local_46 = (undefined1)(fVar2 >> 0x10);
  local_45 = (undefined1)(fVar2 >> 8);
  local_44 = (undefined1)fVar2;
  local_43 = 0x203a;
  local_41 = 0;
  local_40._M_dataplus._M_p._0_4_ = ti;
  pmVar3 = std::
           map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
           ::operator[](&g_cman.m_mpnfCompressionInfo,(key_type_conflict *)&local_40);
  dVar1 = *pmVar3;
  sVar4 = strlen(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,&local_48,sVar4);
  fxdVersion = 0;
  switch(ti) {
  case ktiFeat:
    fxdVersion = g_cman.m_fxdFeatTableVersion;
    break;
  case ktiGlat:
    fxdVersion = g_cman.m_fxdGlatTableVersion;
    break;
  case ktiGloc:
    fxdVersion = g_cman.m_fxdGlocTableVersion;
    break;
  case ktiSilf:
    fxdVersion = g_cman.m_fxdSilfTableVersion;
    break;
  case ktiSill:
    fxdVersion = g_cman.m_fxdSillTableVersion;
  }
  VersionString_abi_cxx11_(&local_40,fxdVersion);
  std::__ostream_insert<char,std::char_traits<char>>
            (strmOut,(char *)CONCAT44(local_40._M_dataplus._M_p._4_4_,
                                      (TableId)local_40._M_dataplus._M_p),local_40._M_string_length)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(TableId)local_40._M_dataplus._M_p) !=
      &local_40.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_40._M_dataplus._M_p._4_4_,(TableId)local_40._M_dataplus._M_p),
                    local_40.field_2._M_allocated_capacity + 1);
  }
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    std::__ostream_insert<char,std::char_traits<char>>(strmOut," compressed (",0xd);
    poVar5 = (ostream *)std::ostream::operator<<(strmOut,(int)(100.0 / (dVar1 + 1.0)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"% of original)",0xe);
  }
  std::ios::widen((char)strmOut->_vptr_basic_ostream[-3] + (char)strmOut);
  std::ostream::put((char)strmOut);
  std::ostream::flush();
  return;
}

Assistant:

void WriteTableDescriptionString(std::ostream& strmOut, TableId ti)
{
    uint32 nTag = TtfUtil::TableIdTag(ti);
    char csTagStr[] = {' ', (char)(nTag >> 24), (char)(nTag >> 16), (char)(nTag >> 8), (char)nTag, ':', ' ', 0 };
    double dCompressionRatio = g_cman.CompressionRatio(ti);
    strmOut << csTagStr << VersionString(g_cman.TableVersion(ti));

    if (dCompressionRatio)
        strmOut << " compressed (" << int(100/(1+dCompressionRatio)) << "% of original)";
    strmOut << std::endl;
}